

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorTables::FieldsByLowercaseNamesLazyInitInternal
          (FileDescriptorTables *this)

{
  _Hash_node_base field_00;
  FieldsByNameMap *collection;
  __node_base *p_Var1;
  FieldDescriptor *field;
  PointerStringPair lowercase_key;
  FieldDescriptor *local_50;
  first_type local_48;
  
  p_Var1 = &(this->symbols_by_parent_)._M_h._M_before_begin;
  collection = &this->fields_by_lowercase_name_;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    field_00._M_nxt = p_Var1[1]._M_nxt;
    if (((FieldDescriptor *)field_00._M_nxt != (FieldDescriptor *)0x0) &&
       (*(char *)&(field_00._M_nxt)->_M_nxt == '\x02')) {
      local_50 = (FieldDescriptor *)field_00._M_nxt;
      local_48.first = FindParentForFieldsByMap(this,(FieldDescriptor *)field_00._M_nxt);
      stringpiece_internal::StringPiece::StringPiece
                (&local_48.second,
                 *(char **)(*(long *)(field_00._M_nxt + 1) +
                           (ulong)(((byte)*(undefined1 *)((long)&(field_00._M_nxt)->_M_nxt + 3) & 3)
                                  << 5)));
      this = (FileDescriptorTables *)collection;
      InsertIfNotPresent<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                (collection,&local_48,&local_50);
    }
  }
  return;
}

Assistant:

void FileDescriptorTables::FieldsByLowercaseNamesLazyInitInternal() const {
  for (Symbol symbol : symbols_by_parent_) {
    const FieldDescriptor* field = symbol.field_descriptor();
    if (!field) continue;
    PointerStringPair lowercase_key(FindParentForFieldsByMap(field),
                                    field->lowercase_name().c_str());
    InsertIfNotPresent(&fields_by_lowercase_name_, lowercase_key, field);
  }
}